

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lucas.c
# Opt level: O1

void jacobi(float (*aa) [2],int n,float *d,float (*v) [2],int *nrot)

{
  float fVar1;
  long lVar2;
  float *pfVar3;
  float *extraout_RDX;
  undefined4 in_register_00000034;
  float *pfVar4;
  float *in_R9;
  uint uVar5;
  float fVar6;
  float fVar7;
  double dVar8;
  double dVar9;
  float fVar10;
  float fVar11;
  float z [2];
  float b [2];
  float a [2] [2];
  float local_68 [2];
  float *pfStack_60;
  undefined1 local_58 [12];
  undefined4 uStack_4c;
  undefined1 local_48 [16];
  float local_38 [6];
  
  if (n != 2) {
    pfVar4 = (float *)(ulong)(uint)n;
    jacobi_cold_1();
    pfVar3 = (float *)CONCAT44(in_register_00000034,n);
    fVar7 = *extraout_RDX;
    fVar6 = extraout_RDX[2];
    fVar10 = extraout_RDX[3];
    fVar11 = extraout_RDX[1];
    dVar8 = (double)(fVar7 * fVar7 + fVar6 * fVar6);
    if (dVar8 < 0.0) {
      dVar8 = sqrt(dVar8);
    }
    else {
      dVar8 = SQRT(dVar8);
    }
    dVar9 = (double)(extraout_RDX[1] * extraout_RDX[1] + extraout_RDX[3] * extraout_RDX[3]);
    if (dVar9 < 0.0) {
      dVar9 = sqrt(dVar9);
    }
    else {
      dVar9 = SQRT(dVar9);
    }
    dVar8 = acos((double)(fVar11 * fVar7 + fVar10 * fVar6) / (dVar8 * dVar9));
    *stack0xffffffffffffffb0 = (float)((dVar8 * 180.0) / 3.141592653589793);
    fVar7 = *pfVar4 * *extraout_RDX + pfVar4[1] * extraout_RDX[2];
    *nrot = (int)fVar7;
    fVar6 = pfVar4[2] * *extraout_RDX + pfVar4[3] * extraout_RDX[2];
    ((float *)nrot)[1] = fVar6;
    fVar7 = fVar7 - *pfVar3 * *extraout_RDX;
    *nrot = (int)fVar7;
    fVar6 = fVar6 - *pfVar3 * extraout_RDX[2];
    ((float *)nrot)[1] = fVar6;
    fVar7 = fVar7 * fVar7 + fVar6 * fVar6;
    if (fVar7 < 0.0) {
      fVar7 = sqrtf(fVar7);
    }
    else {
      fVar7 = SQRT(fVar7);
    }
    *pfStack_60 = fVar7;
    fVar7 = *pfVar4 * extraout_RDX[1] + pfVar4[1] * extraout_RDX[3];
    *in_R9 = fVar7;
    fVar6 = pfVar4[2] * extraout_RDX[1] + pfVar4[3] * extraout_RDX[3];
    in_R9[1] = fVar6;
    fVar7 = fVar7 - pfVar3[1] * extraout_RDX[1];
    *in_R9 = fVar7;
    fVar6 = fVar6 - pfVar3[1] * extraout_RDX[3];
    in_R9[1] = fVar6;
    fVar7 = fVar7 * fVar7 + fVar6 * fVar6;
    if (fVar7 < 0.0) {
      fVar7 = sqrtf(fVar7);
    }
    else {
      fVar7 = SQRT(fVar7);
    }
    *(float *)local_58._0_8_ = fVar7;
    return;
  }
  lVar2 = 0;
  pfVar3 = *v;
  do {
    v[lVar2] = (float  [2])0x0;
    *(float (*) [2])(local_38 + lVar2 * 2) = aa[lVar2];
    *pfVar3 = 1.0;
    lVar2 = lVar2 + 1;
    pfVar3 = pfVar3 + 3;
  } while (lVar2 == 1);
  local_68[0] = 0.0;
  local_68[1] = 0.0;
  pfVar3 = local_38;
  lVar2 = 0;
  do {
    fVar7 = *pfVar3;
    d[lVar2] = fVar7;
    *(float *)(local_58 + lVar2 * 4 + -8) = fVar7;
    lVar2 = lVar2 + 1;
    pfVar3 = pfVar3 + 3;
  } while (lVar2 == 1);
  *nrot = 0;
  uVar5 = 0;
  local_48._0_4_ = local_38[1];
  do {
    uStack_4c = 0;
    local_58._8_4_ = 0;
    local_58._4_4_ = 0;
    if (((float)local_48._0_4_ == 0.0) && (!NAN((float)local_48._0_4_))) {
      return;
    }
    fVar6 = ABS((float)local_48._0_4_);
    fVar7 = fVar6 * 0.2 * 0.25;
    if (2 < uVar5) {
      fVar7 = 0.0;
    }
    fVar10 = fVar6 * 100.0;
    if (uVar5 < 4) {
LAB_001043b0:
      fVar1 = (float)local_48._0_4_;
      if (fVar7 < fVar6) {
        fVar6 = d[1] - *d;
        fVar7 = ABS(fVar6);
        local_48._4_4_ = local_58._4_4_;
        local_48._8_4_ = local_58._8_4_;
        local_48._12_4_ = uStack_4c;
        if ((fVar10 + fVar7 != fVar7) || (NAN(fVar10 + fVar7) || NAN(fVar7))) {
          local_58._0_4_ = (fVar6 * 0.5) / (float)local_48._0_4_;
          dVar8 = (double)((float)local_58._0_4_ * (float)local_58._0_4_) + 1.0;
          if (dVar8 < 0.0) {
            local_48 = ZEXT416((uint)local_48._0_4_);
            _local_58 = ZEXT416((uint)local_58._0_4_);
            dVar8 = sqrt(dVar8);
          }
          else {
            dVar8 = SQRT(dVar8);
          }
          local_58._4_4_ = 0;
          local_58._8_4_ = 0;
          uStack_4c = 0;
          fVar6 = (float)(1.0 / ((double)ABS((float)local_58._0_4_) + dVar8));
          if ((float)local_58._0_4_ < 0.0) {
            local_58._4_4_ = 0x80000000;
            local_58._8_4_ = 0x80000000;
            uStack_4c = 0x80000000;
            fVar6 = -fVar6;
          }
        }
        else {
          fVar6 = (float)local_48._0_4_ / fVar6;
        }
        dVar8 = (double)(fVar6 * fVar6) + 1.0;
        if (dVar8 < 0.0) {
          local_58._0_4_ = fVar6;
          dVar8 = sqrt(dVar8);
        }
        else {
          dVar8 = SQRT(dVar8);
          local_58._0_4_ = fVar6;
        }
        local_48._0_4_ = (float)local_48._0_4_ * (float)local_58._0_4_;
        local_58._0_4_ = (float)local_58._0_4_ * (float)(1.0 / dVar8);
        fVar7 = (float)local_58._0_4_ / ((float)(1.0 / dVar8) + 1.0);
        local_68[1] = local_68[1] + (float)local_48._0_4_;
        local_68[0] = local_68[0] - (float)local_48._0_4_;
        *d = *d - (float)local_48._0_4_;
        d[1] = (float)local_48._0_4_ + d[1];
        lVar2 = 0;
        do {
          fVar6 = v[lVar2][0];
          fVar10 = v[lVar2][1];
          v[lVar2][0] = (fVar6 * fVar7 + fVar10) * -(float)local_58._0_4_ + fVar6;
          v[lVar2][1] = (fVar6 - fVar10 * fVar7) * (float)local_58._0_4_ + fVar10;
          lVar2 = lVar2 + 1;
        } while (lVar2 == 1);
        *nrot = *nrot + 1;
        fVar1 = 0.0;
      }
    }
    else {
      fVar11 = ABS(*d);
      if ((fVar10 + fVar11 != fVar11) || (NAN(fVar10 + fVar11) || NAN(fVar11))) goto LAB_001043b0;
      fVar11 = ABS(d[1]);
      if ((fVar10 + fVar11 != fVar11) || (fVar1 = 0.0, NAN(fVar10 + fVar11) || NAN(fVar11)))
      goto LAB_001043b0;
    }
    local_48._0_4_ = fVar1;
    lVar2 = 0;
    do {
      fVar7 = local_68[lVar2];
      fVar6 = *(float *)(local_58 + lVar2 * 4 + -8);
      *(float *)(local_58 + lVar2 * 4 + -8) = fVar7 + fVar6;
      d[lVar2] = fVar7 + fVar6;
      local_68[lVar2] = 0.0;
      lVar2 = lVar2 + 1;
    } while (lVar2 == 1);
    uVar5 = uVar5 + 1;
    if (uVar5 == 100) {
      return;
    }
  } while( true );
}

Assistant:

void jacobi(float aa[N][N], int n, float d[N], float v[N][N],
int *nrot)
{
int j,iq,ip,i;
float thresh,theta,tau,t,sm,s,h,g,c;
float b[N],z[N],a[N][N];

if(n!=N) {
    fprintf(stderr,"\nFatal error: n %d not N %d in jacobi\n",n,N);
    exit(EXIT_FAILURE);
    }
for(ip=0;ip<n;ip++) /* Initialize to the identity matrix */
	{
	for(iq=0;iq<n;iq++) v[ip][iq] = 0.0;
	for(iq=0;iq<n;iq++) a[ip][iq] = aa[ip][iq]; /* Don't destroy aa */
	v[ip][ip] = 1.0;
	}
/* Initialize b and d to the diagonals of a */
for(ip=0;ip<n;ip++)
	{
	b[ip] = d[ip] = a[ip][ip];
	z[ip] = 0.0;
	}
*nrot = 0;
for(i=0;i<100;i++)
	{
	sm = 0.0;
	for(ip=0;ip<(n-1);ip++)
		{
		for(iq=ip+1;iq<n;iq++)
			sm += (float) fabs(a[ip][iq]);
		}

	/* Normal return, which relies on quadratic convergence to
	   machine underflow */
	if(sm == 0.0) return;

	if(i<3) thresh=(float) (0.2*sm/(n*n)); /* on the first three sweeps */
	else thresh = 0.0; /* the rest of the sweeps */

	for(ip=0;ip<(n-1);ip++)
		{
		for(iq=ip+1;iq<n;iq++)
			{
			g = (float)(100.0*fabs(a[ip][iq]));
			/* After 4 sweeps skip the rotation if the
			   off diagonal element is small */
			if(i>3 && fabs(d[ip])+g == fabs(d[ip])
			       && fabs(d[iq])+g == fabs(d[iq])) a[ip][iq] = 0.0;
			else if(fabs(a[ip][iq]) > thresh)
				{
				h = d[iq]-d[ip];
				if(fabs(h)+g==fabs(h)) t=(a[ip][iq])/h;
				else
				  {
				  theta = 0.5f*h/(a[ip][iq]);
				  t = (float)(1.0/(fabs(theta)+sqrt(1.0+theta*theta)));
				  if(theta < 0.0) t = -t;
				  }
				c = (float)(1.0/sqrt(1.0+t*t));
				s = t*c;
				tau = s/(1.0f+c);
				h = t*a[ip][iq];
				z[ip] -= h;
				z[iq] += h;
				d[ip] -= h;
				d[iq] += h;
				a[ip][iq] = 0.0;
				for(j=0;j<ip-1;j++)
					rotate(a,j,ip,j,iq,&h,&g,s,tau);
				for(j=ip+1;j<iq-1;j++)
					rotate(a,ip,j,j,iq,&h,&g,s,tau);
				for(j=iq+1;j<n;j++)
					rotate(a,ip,j,iq,j,&h,&g,s,tau);
				for(j=0;j<n;j++)
					rotate(v,j,ip,j,iq,&h,&g,s,tau);
				++(*nrot);
				}
			}
		}
	for(ip=0;ip<n;ip++)
		{
		b[ip] += z[ip];
		d[ip] = b[ip];
		z[ip] = 0.0;
		}
	}
/* fprintf(stderr,"\nFatal error: too many iterations in jacobi\n"); */
}